

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O1

BN_MONT_CTX * BN_MONT_CTX_new(void)

{
  BN_MONT_CTX *ctx;
  int in_EDX;
  char *in_RSI;
  
  ctx = (BN_MONT_CTX *)CRYPTO_malloc(0x68,in_RSI,in_EDX);
  if (ctx == (BN_MONT_CTX *)0x0) {
    ctx = (BN_MONT_CTX *)0x0;
  }
  else {
    BN_MONT_CTX_init(ctx);
    ctx->flags = 1;
  }
  return ctx;
}

Assistant:

BN_MONT_CTX *BN_MONT_CTX_new(void)
{
    BN_MONT_CTX *ret;

    if ((ret = CRYPTO_malloc(sizeof(*ret))) == NULL)
        return (NULL);

    BN_MONT_CTX_init(ret);
    ret->flags = BN_FLG_MALLOCED;
    return (ret);
}